

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

bool __thiscall
qclab::dense::SquareMatrix<std::complex<float>_>::operator==
          (SquareMatrix<std::complex<float>_> *this,SquareMatrix<std::complex<float>_> *other)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined1 *puVar4;
  long lVar5;
  undefined1 *puVar6;
  long lVar7;
  long lVar8;
  
  lVar3 = other->size_;
  if (lVar3 != this->size_) {
    return false;
  }
  lVar5 = 0;
  lVar7 = 0;
  if (0 < lVar3) {
    lVar7 = lVar3;
  }
  puVar6 = (undefined1 *)
           ((long)&((this->data_)._M_t.
                    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                    .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl)->_M_value + 4
           );
  puVar4 = (undefined1 *)
           ((long)&((other->data_)._M_t.
                    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                    .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl)->_M_value + 4
           );
  do {
    if (lVar5 == lVar7) {
      return lVar3 <= lVar5;
    }
    lVar8 = 0;
    while (lVar3 != lVar8) {
      if (*(float *)(puVar4 + lVar8 * 8 + -4) != *(float *)(puVar6 + lVar8 * 8 + -4)) {
        return false;
      }
      if (NAN(*(float *)(puVar4 + lVar8 * 8 + -4)) || NAN(*(float *)(puVar6 + lVar8 * 8 + -4))) {
        return false;
      }
      lVar1 = lVar8 * 8;
      lVar2 = lVar8 * 8;
      lVar8 = lVar8 + 1;
      if (*(float *)(puVar4 + lVar1) != *(float *)(puVar6 + lVar2)) {
        return false;
      }
      if (NAN(*(float *)(puVar4 + lVar1)) || NAN(*(float *)(puVar6 + lVar2))) {
        return false;
      }
    }
    lVar5 = lVar5 + 1;
    puVar6 = puVar6 + lVar3 * 8;
    puVar4 = puVar4 + lVar3 * 8;
  } while( true );
}

Assistant:

inline int64_t rows() const { return size_ ; }